

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall
userDefinedUnits_fileOp3_Test::~userDefinedUnits_fileOp3_Test(userDefinedUnits_fileOp3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, fileOp3)
{
    auto outputstr = definedUnitsFromFile(
        TEST_FILE_FOLDER "/test_unit_files/other_units3.txt");
    EXPECT_TRUE(outputstr.empty());
    auto y1 = unit_from_string("bl==p");
    EXPECT_EQ(y1, precise_unit(18.7, precise::us::cup));
    EXPECT_EQ(to_string(y1), "bl==p");

    auto y2 = unit_from_string("y,,p");
    EXPECT_EQ(y2, precise_unit(9.0, precise::ton));
    EXPECT_EQ(to_string(y2), "y,,p");

    auto y3 = unit_from_string("'np");
    EXPECT_EQ(y3, precise_unit(14.0, precise::kg));
    EXPECT_EQ(to_string(y3), "'np");

    auto y4 = unit_from_string("j\"\"");
    EXPECT_EQ(y4, precise_unit(13.5, precise::W));
    EXPECT_EQ(to_string(y4), "j\"\"");

    auto y5 = unit_from_string("q\"\"");
    EXPECT_EQ(y5, precise_unit(15.5, precise::W));
    EXPECT_EQ(to_string(y5), "q\"\"");
    clearUserDefinedUnits();
}